

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

_Bool get_quoted_string(HttpProxyNegotiator *s)

{
  char cVar1;
  strbuf *psVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  
  psVar2 = s->header;
  uVar5 = s->header_pos;
  uVar3 = psVar2->len;
  uVar6 = uVar5;
  if (uVar5 < uVar3) {
    do {
      uVar6 = uVar5;
      if ((0x20 < (ulong)(byte)psVar2->s[uVar5]) ||
         ((0x100000600U >> ((ulong)(byte)psVar2->s[uVar5] & 0x3f) & 1) == 0)) break;
      uVar5 = uVar5 + 1;
      uVar6 = uVar3;
    } while (uVar3 != uVar5);
  }
  if ((uVar6 != uVar3) && (psVar2->s[uVar6] == '\"')) {
    strbuf_shrink_to(s->token,0);
    while( true ) {
      uVar5 = uVar6 + 1;
      uVar3 = s->header->len;
      if (uVar3 <= uVar5) break;
      pcVar4 = s->header->s;
      cVar1 = pcVar4[uVar5];
      if (cVar1 == '\\') {
        uVar5 = uVar6 + 2;
        if (uVar5 == uVar3) {
          return false;
        }
      }
      else if (cVar1 == '\"') break;
      BinarySink_put_byte(s->token->binarysink_,pcVar4[uVar5]);
      uVar6 = uVar5;
    }
    if (uVar5 != uVar3) {
      s->header_pos = uVar6 + 2;
      return true;
    }
  }
  return false;
}

Assistant:

static bool get_quoted_string(HttpProxyNegotiator *s)
{
    size_t pos = s->header_pos;

    while (pos < s->header->len && is_whitespace(s->header->s[pos]))
        pos++;

    if (pos == s->header->len)
        return false;                  /* end of string */

    if (s->header->s[pos] != '"')
        return false;
    pos++;

    strbuf_clear(s->token);
    while (pos < s->header->len && s->header->s[pos] != '"') {
        if (s->header->s[pos] == '\\') {
            /* Backslash makes the next char literal, even if it's " or \ */
            pos++;
            if (pos == s->header->len)
                return false;          /* unexpected end of string */
        }
        put_byte(s->token, s->header->s[pos++]);
    }

    if (pos == s->header->len)
        return false;                  /* no closing quote */
    pos++;

    s->header_pos = pos;
    return true;
}